

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O2

REF_STATUS
ref_edge_rcm_queue(REF_EDGE ref_edge,REF_INT node,REF_INT *o2n,REF_INT *n2o,REF_INT *ndone,
                  REF_INT *queue,REF_INT *nqueue)

{
  int iVar1;
  REF_ADJ ref_adj;
  uint uVar2;
  REF_INT *pRVar3;
  undefined8 uVar4;
  ulong uVar5;
  REF_INT RVar6;
  REF_INT degree;
  REF_INT nhere;
  REF_INT *local_40;
  REF_EDGE local_38;
  
  ref_adj = ref_edge->adj;
  n2o[*ndone] = node;
  iVar1 = *ndone;
  o2n[node] = iVar1;
  *ndone = iVar1 + 1;
  nhere = 0;
  uVar5 = 0xffffffff;
  RVar6 = -1;
  local_40 = queue;
  local_38 = ref_edge;
  if (-1 < node) {
    uVar5 = 0xffffffff;
    RVar6 = -1;
    if (node < ref_adj->nnode) {
      uVar2 = ref_adj->first[node];
      uVar5 = 0xffffffff;
      RVar6 = -1;
      if ((long)(int)uVar2 != -1) {
        RVar6 = ref_adj->item[(int)uVar2].ref;
        uVar5 = (ulong)uVar2;
      }
    }
  }
  do {
    if ((int)uVar5 == -1) {
      return 0;
    }
    pRVar3 = local_38->e2n;
    iVar1 = pRVar3[RVar6 * 2];
    if (o2n[iVar1] == -1) {
      o2n[iVar1] = -2;
      uVar2 = ref_adj_degree(ref_adj,iVar1,&degree);
      if (uVar2 != 0) {
        uVar4 = 0x302;
        goto LAB_001955c9;
      }
      ref_edge_rcm_queue_node(iVar1,degree,local_40,nqueue,&nhere);
      pRVar3 = local_38->e2n;
    }
    iVar1 = pRVar3[(int)(RVar6 * 2 | 1)];
    if (o2n[iVar1] == -1) {
      o2n[iVar1] = -2;
      uVar2 = ref_adj_degree(ref_adj,iVar1,&degree);
      if (uVar2 != 0) {
        uVar4 = 0x309;
LAB_001955c9:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               uVar4,"ref_edge_rcm_queue",(ulong)uVar2,"deg");
        return uVar2;
      }
      ref_edge_rcm_queue_node(iVar1,degree,local_40,nqueue,&nhere);
    }
    uVar5 = (ulong)ref_adj->item[(int)uVar5].next;
    RVar6 = -1;
    if (uVar5 != 0xffffffffffffffff) {
      RVar6 = ref_adj->item[uVar5].ref;
    }
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_edge_rcm_queue(REF_EDGE ref_edge, REF_INT node,
                                             REF_INT *o2n, REF_INT *n2o,
                                             REF_INT *ndone, REF_INT *queue,
                                             REF_INT *nqueue) {
  REF_ADJ ref_adj = ref_edge_adj(ref_edge);
  REF_INT item, ref, other, degree;
  REF_INT nhere;
  n2o[(*ndone)] = node;
  o2n[node] = (*ndone);
  (*ndone)++;
  nhere = 0;

  /* printf("%d done %d nq %d\n", *ndone, node, *nqueue); */

  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    other = ref_edge_e2n(ref_edge, 0, ref);
    if (REF_EMPTY == o2n[other]) {
      o2n[other] = -2; /* mark as queued */
      RSS(ref_adj_degree(ref_adj, other, &degree), "deg");
      RSS(ref_edge_rcm_queue_node(other, degree, queue, nqueue, &nhere),
          "queue n0");
    }
    other = ref_edge_e2n(ref_edge, 1, ref);
    if (REF_EMPTY == o2n[other]) {
      o2n[other] = -2; /* mark as queued */
      RSS(ref_adj_degree(ref_adj, other, &degree), "deg");
      RSS(ref_edge_rcm_queue_node(other, degree, queue, nqueue, &nhere),
          "queue n1");
    }
  }

  return REF_SUCCESS;
}